

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O3

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<3,_5,_1>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  undefined1 auVar1 [16];
  long lVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [16];
  float fVar6;
  float afStack_30 [2];
  undefined8 local_28;
  float local_20;
  int aiStack_18 [6];
  
  fVar3 = -0.2;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    fVar6 = evalCtx->in[0].m_data[1];
    fVar4 = evalCtx->in[1].m_data[1];
    auVar5._4_4_ = evalCtx->in[1].m_data[0];
    auVar5._0_4_ = evalCtx->in[0].m_data[0];
    auVar5._8_4_ = evalCtx->in[0].m_data[2];
    auVar5._12_4_ = evalCtx->in[0].m_data[3];
  }
  else {
    auVar5 = ZEXT816(0x3f800000bdcccccd);
    fVar4 = 0.0;
    fVar6 = -0.2;
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    fVar3 = (evalCtx->coords).m_data[0];
  }
  auVar1._4_4_ = fVar3;
  auVar1._0_4_ = fVar3;
  auVar1._8_8_ = 0;
  auVar5 = divps(auVar5,auVar1);
  local_28 = auVar5._0_8_;
  local_20 = fVar4 / fVar3 + fVar6 / fVar3;
  aiStack_18[2] = 0;
  aiStack_18[3] = 1;
  aiStack_18[4] = 2;
  lVar2 = 2;
  do {
    (evalCtx->color).m_data[aiStack_18[lVar2]] = afStack_30[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 / in1);
	}